

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

int Super_CompareGates(Super_Man_t *pMan,uint *uTruth,float Area,float *tPinDelaysRes,int nPins)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Super_Gate_t_conflict *local_80;
  Super_Gate_t_conflict *local_78;
  ABC_PTRUINT_T Key;
  int fGateIsBetter;
  int fNewIsBetter;
  int i;
  Super_Gate_t_conflict *pGate2;
  Super_Gate_t_conflict *pGate;
  Super_Gate_t_conflict *pPrev;
  Super_Gate_t_conflict **ppList;
  float *pfStack_30;
  int nPins_local;
  float *tPinDelaysRes_local;
  uint *puStack_20;
  float Area_local;
  uint *uTruth_local;
  Super_Man_t *pMan_local;
  
  if (pMan->nVarsMax < 6) {
    if ((*uTruth == 0) || (*uTruth == 0xffffffff)) {
      return 0;
    }
  }
  else if (((*uTruth == 0) && (uTruth[1] == 0)) ||
          ((*uTruth == 0xffffffff && (uTruth[1] == 0xffffffff)))) {
    return 0;
  }
  ppList._4_4_ = nPins;
  pfStack_30 = tPinDelaysRes;
  tPinDelaysRes_local._4_4_ = Area;
  puStack_20 = uTruth;
  uTruth_local = (uint *)pMan;
  iVar3 = stmm_find(pMan->tTable,(char *)(ulong)(*uTruth ^ uTruth[1]),(char ***)&pPrev);
  if (iVar3 != 0) {
    pGate = (Super_Gate_t_conflict *)0x0;
    pGate2 = (Super_Gate_t_conflict *)pPrev->pRoot;
    if ((Mio_Gate_t *)pGate2 == (Mio_Gate_t *)0x0) {
      local_78 = (Super_Gate_t_conflict *)0x0;
    }
    else {
      local_78 = (Super_Gate_t_conflict *)(((Mio_Gate_t *)pGate2)->field_15).pTruth;
    }
    _fNewIsBetter = local_78;
    while (pGate2 != (Super_Gate_t_conflict *)0x0) {
      uTruth_local[0x2f] = uTruth_local[0x2f] + 1;
      if ((pGate2->uTruth[0] == *puStack_20) && (pGate2->uTruth[1] == puStack_20[1])) {
        bVar2 = false;
        bVar1 = tPinDelaysRes_local._4_4_ <= pGate2->Area + 0.001;
        if (bVar1) {
          bVar2 = tPinDelaysRes_local._4_4_ + 0.001 < pGate2->Area;
        }
        bVar1 = !bVar1;
        for (fGateIsBetter = 0; fGateIsBetter < ppList._4_4_; fGateIsBetter = fGateIsBetter + 1) {
          if (((pGate2->ptDelays[fGateIsBetter] != -9999.0) ||
              (NAN(pGate2->ptDelays[fGateIsBetter]))) &&
             ((pfStack_30[fGateIsBetter] != -9999.0 || (NAN(pfStack_30[fGateIsBetter]))))) {
            if (pfStack_30[fGateIsBetter] <= pGate2->ptDelays[fGateIsBetter] + 0.001) {
              if (pfStack_30[fGateIsBetter] + 0.001 < pGate2->ptDelays[fGateIsBetter]) {
                bVar2 = true;
              }
            }
            else {
              bVar1 = true;
            }
            if ((bVar1) && (bVar2)) break;
          }
        }
        if ((bVar1) && (bVar2)) {
          pGate = pGate2;
        }
        else {
          if (!bVar2) {
            if (!bVar1) {
              return 0;
            }
            return 0;
          }
          if (pGate == (Super_Gate_t_conflict *)0x0) {
            pPrev->pRoot = (Mio_Gate_t *)pGate2->pNext;
          }
          else {
            pGate->pNext = pGate2->pNext;
          }
          Extra_MmFixedEntryRecycle(*(Extra_MmFixed_t **)(uTruth_local + 0x26),(char *)pGate2);
          uTruth_local[0x2c] = uTruth_local[0x2c] + 1;
        }
      }
      else {
        uTruth_local[0x30] = uTruth_local[0x30] + 1;
      }
      pGate2 = _fNewIsBetter;
      if (_fNewIsBetter == (Super_Gate_t_conflict *)0x0) {
        local_80 = (Super_Gate_t_conflict *)0x0;
      }
      else {
        local_80 = _fNewIsBetter->pNext;
      }
      _fNewIsBetter = local_80;
    }
  }
  return 1;
}

Assistant:

int Super_CompareGates( Super_Man_t * pMan, unsigned uTruth[], float Area, float tPinDelaysRes[], int nPins )
{
    Super_Gate_t ** ppList, * pPrev, * pGate, * pGate2;
    int i, fNewIsBetter, fGateIsBetter;
    ABC_PTRUINT_T Key;

    // skip constant functions
    if ( pMan->nVarsMax < 6 )
    {
        if ( uTruth[0] == 0 || ~uTruth[0] == 0 )
            return 0;
    }
    else
    {
        if ( ( uTruth[0] == 0 && uTruth[1] == 0 ) || ( ~uTruth[0] == 0 && ~uTruth[1] == 0 ) )
            return 0;
    }

    // get hold of the place where the entry is stored
//    Key = uTruth[0] + 2003 * uTruth[1];
    Key = uTruth[0] ^ uTruth[1];
    if ( !stmm_find( pMan->tTable, (char *)Key, (char ***)&ppList ) )
        return 1; 
    // the entry with this truth table is found
    pPrev = NULL;
    for ( pGate = *ppList, pGate2 = pGate? pGate->pNext: NULL; pGate; 
        pGate = pGate2, pGate2 = pGate? pGate->pNext: NULL )
    {
        pMan->nLookups++;
        if ( pGate->uTruth[0] != uTruth[0] || pGate->uTruth[1] != uTruth[1] )
        {
            pMan->nAliases++;
            continue;
        }
        fGateIsBetter = 0;
        fNewIsBetter  = 0;
        if ( pGate->Area + SUPER_EPSILON < Area )
            fGateIsBetter = 1;
        else if ( pGate->Area > Area + SUPER_EPSILON )
            fNewIsBetter = 1;
        for ( i = 0; i < nPins; i++ )
        {
            if ( pGate->ptDelays[i] == SUPER_NO_VAR || tPinDelaysRes[i] == SUPER_NO_VAR )
                continue;
            if ( pGate->ptDelays[i] + SUPER_EPSILON < tPinDelaysRes[i] )
                fGateIsBetter = 1;
            else if ( pGate->ptDelays[i] > tPinDelaysRes[i] + SUPER_EPSILON )
                fNewIsBetter = 1;
            if ( fGateIsBetter && fNewIsBetter )
                break;
        }
        // consider 4 cases
        if ( fGateIsBetter && fNewIsBetter ) // Pareto points; save both
            pPrev = pGate;
        else if ( fNewIsBetter ) // gate is worse; remove the gate
        {
            if ( pPrev == NULL )
                *ppList = pGate->pNext;
            else
                pPrev->pNext = pGate->pNext;
            Extra_MmFixedEntryRecycle( pMan->pMem, (char *)pGate );
            pMan->nRemoved++;
        }
        else if ( fGateIsBetter ) // new is worse, already dominated no need to see others
            return 0;
        else // if ( !fGateIsBetter && !fNewIsBetter ) // they are identical, no need to see others
            return 0;
    }
    return 1;
}